

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_> *
__thiscall
Catch::clara::detail::Opt::getHelpColumns
          (vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>
           *__return_storage_ptr__,Opt *this)

{
  initializer_list<Catch::clara::detail::HelpColumns> __l;
  bool bVar1;
  bool bVar2;
  ostream *poVar3;
  HelpColumns *local_268;
  allocator<Catch::clara::detail::HelpColumns> local_221;
  undefined1 *local_220;
  undefined1 local_218 [64];
  undefined1 local_1d8 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *opt;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  ostringstream local_190 [7];
  bool first;
  ostringstream oss;
  Opt *this_local;
  
  ::std::__cxx11::ostringstream::ostringstream(local_190);
  bVar2 = true;
  __end3 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&this->m_optNames);
  opt = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(&this->m_optNames);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      (&__end3,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&opt);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_1d8._32_8_ =
         __gnu_cxx::
         __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator*(&__end3);
    if (bVar2) {
      bVar2 = false;
    }
    else {
      ::std::operator<<((ostream *)local_190,", ");
    }
    ::std::operator<<((ostream *)local_190,(string *)local_1d8._32_8_);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end3);
  }
  bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    (&(this->super_ParserRefImpl<Catch::clara::detail::Opt>).m_hint);
  if (!bVar2) {
    poVar3 = ::std::operator<<((ostream *)local_190," <");
    poVar3 = ::std::operator<<(poVar3,(string *)
                                      &(this->super_ParserRefImpl<Catch::clara::detail::Opt>).m_hint
                              );
    ::std::operator<<(poVar3,">");
  }
  local_220 = local_218;
  ::std::__cxx11::ostringstream::str();
  ::std::__cxx11::string::string
            ((string *)(local_218 + 0x20),
             &(this->super_ParserRefImpl<Catch::clara::detail::Opt>).m_description);
  local_1d8._0_8_ = local_218;
  local_1d8._8_8_ = 1;
  std::allocator<Catch::clara::detail::HelpColumns>::allocator(&local_221);
  __l._M_len = local_1d8._8_8_;
  __l._M_array = (iterator)local_1d8._0_8_;
  std::vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>
  ::vector(__return_storage_ptr__,__l,&local_221);
  std::allocator<Catch::clara::detail::HelpColumns>::~allocator(&local_221);
  local_268 = (HelpColumns *)local_1d8;
  do {
    local_268 = local_268 + -1;
    HelpColumns::~HelpColumns(local_268);
  } while (local_268 != (HelpColumns *)local_218);
  ::std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

auto getHelpColumns() const -> std::vector<HelpColumns> {
            std::ostringstream oss;
            bool first = true;
            for( auto const &opt : m_optNames ) {
                if (first)
                    first = false;
                else
                    oss << ", ";
                oss << opt;
            }
            if( !m_hint.empty() )
                oss << " <" << m_hint << ">";
            return { { oss.str(), m_description } };
        }